

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O2

bool __thiscall
QTranslatorPrivate::do_load(QTranslatorPrivate *this,uchar *data,qsizetype len,QString *directory)

{
  uchar uVar1;
  byte bVar2;
  undefined1 *puVar3;
  Data *pDVar4;
  QIODevice *pQVar5;
  bool bVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
  *this_00;
  uint uVar11;
  char *utf8;
  uchar *puVar12;
  QString *pQVar13;
  long in_FS_OFFSET;
  _Head_base<0UL,_QTranslator_*,_false> local_a0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<QString> local_78;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  puVar12 = data + 0x10;
  while (((puVar12 < data + len + -5 && (uVar1 = *puVar12, uVar1 != '\0')) &&
         (uVar8 = *(uint *)(puVar12 + 1), uVar8 != 0))) {
    pQVar13 = (QString *)(puVar12 + 5);
    uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    if ((uint)(((int)data + (int)len) - (int)pQVar13) < uVar8) goto LAB_002a144b;
    utf8 = (char *)(ulong)uVar8;
    if (uVar1 == '/') {
      this->contextArray = (uchar *)pQVar13;
      this->contextLength = uVar8;
    }
    else if (uVar1 == 'B') {
      this->offsetArray = (uchar *)pQVar13;
      this->offsetLength = uVar8;
    }
    else if (uVar1 == 'i') {
      this->messageArray = (uchar *)pQVar13;
      this->messageLength = uVar8;
    }
    else if (uVar1 == 0x88) {
      this->numerusRulesArray = (uchar *)pQVar13;
      this->numerusRulesLength = uVar8;
    }
    else if (uVar1 == 0x96) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::fromRawData((QByteArray *)&local_98,(char *)pQVar13,(qsizetype)utf8);
      QDataStream::QDataStream((QDataStream *)local_58,(QByteArray *)&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
      local_98.d = (Data *)0x0;
      local_98.ptr = (char16_t *)0x0;
      local_98.size = 0;
      while (bVar6 = QDataStream::atEnd((QDataStream *)local_58), !bVar6) {
        ::operator>>((QDataStream *)local_58,(QString *)&local_98);
        QList<QString>::emplaceBack<QString_const&>
                  ((QList<QString> *)&local_78,(QString *)&local_98);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QDataStream::~QDataStream((QDataStream *)local_58);
    }
    else if (uVar1 == 0xa7) {
      QString::fromUtf8((QString *)local_58,pQVar13,utf8,(ulong)uVar8);
      pDVar4 = (this->language).d.d;
      pQVar5 = (QIODevice *)(this->language).d.ptr;
      (this->language).d.d = (Data *)local_58._0_8_;
      (this->language).d.ptr = (char16_t *)local_58._8_8_;
      puVar3 = (undefined1 *)(this->language).d.size;
      (this->language).d.size = (qsizetype)local_48;
      local_58._0_8_ = pDVar4;
      local_58._8_8_ = pQVar5;
      local_48 = puVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    }
    puVar12 = (uchar *)(utf8 + (long)&pQVar13->d);
  }
  uVar8 = this->numerusRulesLength;
  if (uVar8 != 0) {
    uVar10 = 0;
    do {
      if ((uVar10 + 1 == uVar8) || (bVar2 = this->numerusRulesArray[uVar10], (char)bVar2 < '\0'))
      goto LAB_002a144b;
      uVar11 = bVar2 & 7;
      uVar9 = uVar10 + 2;
      if (2 < uVar11 - 1) {
        if ((uVar11 != 4) || (uVar9 == uVar8)) goto LAB_002a144b;
        uVar9 = uVar10 + 3;
      }
      if (uVar9 == uVar8) break;
      uVar10 = uVar9 + 1;
      if ((uVar10 == uVar8) || (this->numerusRulesArray[uVar9] < 0xfd)) goto LAB_002a144b;
    } while( true );
  }
  this_00 = &this->subTranslators;
  std::
  vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
  ::reserve(this_00,local_78.size);
  lVar7 = local_78.size * 0x18;
  pQVar13 = local_78.ptr;
  do {
    if (lVar7 == 0) {
      bVar6 = true;
LAB_002a1460:
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return bVar6;
    }
    local_a0._M_head_impl = (QTranslator *)&DAT_aaaaaaaaaaaaaaaa;
    std::make_unique<QTranslator>();
    local_58._0_8_ = (Data *)0x0;
    local_58._8_8_ = (QIODevice *)0x0;
    local_48 = (undefined1 *)0x0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_98.size = 0;
    bVar6 = QTranslator::load(local_a0._M_head_impl,pQVar13,directory,(QString *)local_58,
                              (QString *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    if (!bVar6) {
      if (local_a0._M_head_impl != (QTranslator *)0x0) {
        (*((local_a0._M_head_impl)->super_QObject)._vptr_QObject[4])();
      }
      std::
      vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
      ::clear(this_00);
LAB_002a144b:
      this->messageLength = 0;
      this->offsetLength = 0;
      this->contextLength = 0;
      this->numerusRulesLength = 0;
      this->contextArray = (uchar *)0x0;
      this->numerusRulesArray = (uchar *)0x0;
      this->messageArray = (uchar *)0x0;
      this->offsetArray = (uchar *)0x0;
      bVar6 = false;
      goto LAB_002a1460;
    }
    std::
    vector<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>,std::allocator<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>>>
    ::emplace_back<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>>
              ((vector<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>,std::allocator<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>>>
                *)this_00,(unique_ptr<QTranslator,_std::default_delete<QTranslator>_> *)&local_a0);
    if (local_a0._M_head_impl != (QTranslator *)0x0) {
      (*((local_a0._M_head_impl)->super_QObject)._vptr_QObject[4])();
    }
    pQVar13 = pQVar13 + 1;
    lVar7 = lVar7 + -0x18;
  } while( true );
}

Assistant:

bool QTranslatorPrivate::do_load(const uchar *data, qsizetype len, const QString &directory)
{
    bool ok = true;
    const uchar *end = data + len;

    data += MagicLength;

    QStringList dependencies;
    while (data < end - 5) {
        quint8 tag = read8(data++);
        quint32 blockLen = read32(data);
        data += 4;
        if (!tag || !blockLen)
            break;
        if (quint32(end - data) < blockLen) {
            ok = false;
            break;
        }

        if (tag == QTranslatorPrivate::Language) {
            language = QString::fromUtf8((const char *)data, blockLen);
        } else if (tag == QTranslatorPrivate::Contexts) {
            contextArray = data;
            contextLength = blockLen;
        } else if (tag == QTranslatorPrivate::Hashes) {
            offsetArray = data;
            offsetLength = blockLen;
        } else if (tag == QTranslatorPrivate::Messages) {
            messageArray = data;
            messageLength = blockLen;
        } else if (tag == QTranslatorPrivate::NumerusRules) {
            numerusRulesArray = data;
            numerusRulesLength = blockLen;
        } else if (tag == QTranslatorPrivate::Dependencies) {
            QDataStream stream(QByteArray::fromRawData((const char*)data, blockLen));
            QString dep;
            while (!stream.atEnd()) {
                stream >> dep;
                dependencies.append(dep);
            }
        }

        data += blockLen;
    }

    if (ok && !isValidNumerusRules(numerusRulesArray, numerusRulesLength))
        ok = false;
    if (ok) {
        subTranslators.reserve(std::size_t(dependencies.size()));
        for (const QString &dependency : std::as_const(dependencies)) {
            auto translator = std::make_unique<QTranslator>();
            ok = translator->load(dependency, directory);
            if (!ok)
                break;
            subTranslators.push_back(std::move(translator));
        }

        // In case some dependencies fail to load, unload all the other ones too.
        if (!ok)
            subTranslators.clear();
    }

    if (!ok) {
        messageArray = nullptr;
        contextArray = nullptr;
        offsetArray = nullptr;
        numerusRulesArray = nullptr;
        messageLength = 0;
        contextLength = 0;
        offsetLength = 0;
        numerusRulesLength = 0;
    }

    return ok;
}